

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BinOpr expr_binop(LexState *ls,ExpDesc *v,uint32_t limit)

{
  uint uVar1;
  BinOpr BVar2;
  uint in_EDX;
  LexState *in_RSI;
  long in_RDI;
  BinOpr nextop;
  ExpDesc v2;
  BinOpr op;
  uint in_stack_ffffffffffffffc8;
  BinOpr in_stack_ffffffffffffffcc;
  FuncState *in_stack_ffffffffffffffd0;
  BinOpr in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint32_t in_stack_ffffffffffffffe4;
  
  synlevel_begin((LexState *)0x12b9dc);
  expr_unop((LexState *)in_stack_ffffffffffffffd0,
            (ExpDesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  BVar2 = token2binop(*(LexToken *)(in_RDI + 0x24));
  while( true ) {
    uVar1 = in_stack_ffffffffffffffc8 & 0xffffff;
    if (BVar2 != OPR_NOBINOPR) {
      uVar1 = CONCAT13(in_EDX < priority[BVar2].left,(int3)in_stack_ffffffffffffffc8);
    }
    in_stack_ffffffffffffffc8 = uVar1;
    if ((char)(in_stack_ffffffffffffffc8 >> 0x18) == '\0') break;
    lj_lex_next((LexState *)0x12ba39);
    bcemit_binop_left(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(ExpDesc *)0x12ba4f);
    in_stack_ffffffffffffffcc =
         expr_binop(in_RSI,(ExpDesc *)CONCAT44(in_EDX,BVar2),in_stack_ffffffffffffffe4);
    bcemit_binop((FuncState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,(ExpDesc *)in_stack_ffffffffffffffd0,
                 (ExpDesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    BVar2 = in_stack_ffffffffffffffcc;
  }
  *(int *)(in_RDI + 0x94) = *(int *)(in_RDI + 0x94) + -1;
  return BVar2;
}

Assistant:

static BinOpr expr_binop(LexState *ls, ExpDesc *v, uint32_t limit)
{
  BinOpr op;
  synlevel_begin(ls);
  expr_unop(ls, v);
  op = token2binop(ls->token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    ExpDesc v2;
    BinOpr nextop;
    lj_lex_next(ls);
    bcemit_binop_left(ls->fs, op, v);
    /* Parse binary expression with higher priority. */
    nextop = expr_binop(ls, &v2, priority[op].right);
    bcemit_binop(ls->fs, op, v, &v2);
    op = nextop;
  }
  synlevel_end(ls);
  return op;  /* Return unconsumed binary operator (if any). */
}